

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

char * read_file(char *filename,size_t *size)

{
  FILE *__stream;
  runtime_error *prVar1;
  size_t __n;
  char *__ptr;
  size_t sVar2;
  size_t *in_RSI;
  char *in_RDI;
  char *buffer;
  size_t _size;
  FILE *pfile;
  size_t in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  
  __stream = fopen(in_RDI,"rb");
  if (__stream == (FILE *)0x0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"file open error");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fseek(__stream,0,2);
  __n = ftell(__stream);
  __ptr = aligned_malloc<char>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (__ptr == (char *)0x0) {
    fclose(__stream);
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"allocate memory failed");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  rewind(__stream);
  sVar2 = fread(__ptr,1,__n,__stream);
  if (sVar2 != __n) {
    free(__stream);
    fclose(__stream);
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"read data failed");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fclose(__stream);
  __ptr[__n] = '\0';
  *in_RSI = __n;
  return __ptr;
}

Assistant:

char *read_file(const char *filename, size_t *size) {
    std::FILE *pfile = std::fopen(filename, "rb");
    if (pfile == nullptr) throw std::runtime_error("file open error");
    std::fseek(pfile, 0, SEEK_END);
    size_t _size = std::ftell(pfile);
    char *buffer = aligned_malloc(_size + 2 * kAlignmentSize);
    if (buffer == nullptr) {
        std::fclose(pfile);
        throw std::runtime_error("allocate memory failed");
    }
    std::rewind(pfile);
    if (std::fread(buffer, 1, _size, pfile) != _size) {
        free(pfile);
        std::fclose(pfile);
        throw std::runtime_error("read data failed");
    }
    std::fclose(pfile);
    buffer[_size] = '\0';
    *size = _size;
    return buffer;
}